

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>
::find<google::protobuf::FieldDescriptor_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>
           *this,key_arg<const_google::protobuf::FieldDescriptor_*> *key)

{
  size_t hash;
  iterator iVar1;
  
  AssertHashEqConsistent<google::protobuf::FieldDescriptor_const*>(this,key);
  hash = HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash::operator()((Hash *)this,key);
  iVar1 = find_non_soo<google::protobuf::FieldDescriptor_const*>(this,key,hash);
  return iVar1;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertHashEqConsistent(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }